

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dtls-Example.cpp
# Opt level: O2

void ClientThread(bool *bStop)

{
  bool bIsClosed;
  SslUdpSocket sock;
  char local_131;
  duration<long,_std::ratio<1L,_1000L>_> local_130;
  BaseSocket local_128;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  function<void_(UdpSocket_*)> local_90;
  function<void_(UdpSocket_*)> local_70;
  function<void_(BaseSocket_*)> local_50;
  function<void_(BaseSocket_*)> local_30;
  
  SslUdpSocket::SslUdpSocket((SslUdpSocket *)&local_128);
  local_131 = '\0';
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:97:28)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:97:28)>
             ::_M_manager;
  BaseSocket::BindErrorFunction(&local_30,&local_128,(function<void_(BaseSocket_*)> *)&local_f8);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  local_b0._8_8_ = 0;
  local_b0._M_unused._M_object = &local_131;
  local_98 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:98:28)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:98:28)>
             ::_M_manager;
  BaseSocket::BindCloseFunction(&local_50,&local_128,(function<void_(BaseSocket_*)> *)&local_b0);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<void_(UdpSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:99:32)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(UdpSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:99:32)>
              ::_M_manager;
  UdpSocket::BindFuncBytesReceived
            (&local_70,(UdpSocket *)&local_128,(function<void_(UdpSocket_*)> *)&local_118);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(UdpSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:124:30)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(UdpSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:124:30)>
             ::_M_manager;
  local_d0._M_unused._M_object = &local_128;
  SslUdpSocket::BindFuncSslInitDone
            (&local_90,(SslUdpSocket *)&local_128,(function<void_(UdpSocket_*)> *)&local_d0);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  SslUdpSocket::AddCertificate
            ((SslUdpSocket *)&local_128,"certs/client-cert.crt","certs/client-key.pem");
  SslUdpSocket::CreateClientSide
            ((SslUdpSocket *)&local_128,"0.0.0.0",0x777,"127.0.0.1:3461",(char *)0x0);
  while (*bStop == false) {
    local_130.__r = 10;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_130);
  }
  SslUdpSocket::Close((SslUdpSocket *)&local_128);
  while (local_131 == '\0') {
    local_130.__r = 10;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_130);
  }
  BaseSocket::~BaseSocket(&local_128);
  return;
}

Assistant:

void ClientThread(const bool* bStop)
{
    SslUdpSocket sock;
    bool bIsClosed = false;

    // 4 callback function to handle the client socket events
    sock.BindErrorFunction([&](BaseSocket*) { cout << "Client: socket error" << endl; });
    sock.BindCloseFunction([&](BaseSocket*) { cout << "Client: socket closing" << endl; bIsClosed = true; });
    sock.BindFuncBytesReceived([&](UdpSocket* pUdpSocket)
    {
        const size_t nAvailable = pUdpSocket->GetBytesAvailable();

        auto spBuffer = make_unique<uint8_t[]>(nAvailable + 1);

        string strFrom;
        const size_t nRead = pUdpSocket->Read(spBuffer.get(), nAvailable, strFrom);

        if (nRead > 0)
        {
            string strRec(nRead, 0);
            copy(&spBuffer[0], &spBuffer[nRead], &strRec[0]);

            stringstream strOutput;
            const auto tNow = chrono::system_clock::to_time_t(chrono::system_clock::now());
            struct tm stTime;
            if (localtime_s(&stTime, &tNow) == 0)
                strOutput << put_time(&stTime, "%a, %d %b %Y %H:%M:%S") << " - ";
            strOutput << strFrom.c_str() << " - Client received: " << nRead << " Bytes, \"" << strRec << "\"" << endl;

            cout << strOutput.str();
        }
    });

    sock.BindFuncSslInitDone([&](UdpSocket* pUdpSocket)
    {
        sock.Write("Hallo World", 11, "127.0.0.1:3461");
    });

    sock.AddCertificate("certs/client-cert.crt", "certs/client-key.pem");

    const bool bCreated = sock.CreateClientSide("0.0.0.0", 1911, "127.0.0.1:3461");

    while (*bStop == false)
    {
        this_thread::sleep_for(chrono::milliseconds(10));
    }

    sock.Close();
    while (bIsClosed == false)
        this_thread::sleep_for(chrono::milliseconds(10));
}